

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O1

qint64 __thiscall
QHttpSocketEngine::writeDatagram
          (QHttpSocketEngine *this,char *param_1,qint64 param_2,QIpPacketHeader *param_3)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QString local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 2;
  uStack_34 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0;
  local_30 = "default";
  QMessageLogger::warning((char *)&local_48,"Operation is not supported");
  QVar1.m_data = (storage_type *)0x1c;
  QVar1.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar1);
  local_68.d.d = (Data *)CONCAT44(uStack_44,local_48);
  local_68.d.ptr = (char16_t *)CONCAT44(uStack_3c,uStack_40);
  local_68.d.size = CONCAT44(uStack_34,uStack_38);
  QAbstractSocketEngine::setError
            ((QAbstractSocketEngine *)this,UnsupportedSocketOperationError,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return -1;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpSocketEngine::writeDatagram(const char *, qint64, const QIpPacketHeader &)
{
    qWarning("Operation is not supported");
    setError(QAbstractSocket::UnsupportedSocketOperationError, "Unsupported socket operation"_L1);
    return -1;
}